

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-prefs.c
# Opt level: O1

parser_error parse_prefs_entry_renderer(parser *p)

{
  _Bool _Var1;
  wchar_t wVar2;
  int iVar3;
  parser_error pVar4;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  
  pcVar5 = parser_getsym(p,"name");
  wVar2 = ui_entry_renderer_lookup(pcVar5);
  if (wVar2 == L'\0') {
    pVar4 = PARSE_ERROR_INVALID_VALUE;
  }
  else {
    _Var1 = parser_hasval(p,"colors");
    if (_Var1) {
      pcVar6 = parser_getsym(p,"colors");
      iVar3 = strcmp(pcVar6,"*");
      pcVar5 = (char *)0x0;
      if (iVar3 != 0) {
        pcVar5 = pcVar6;
      }
    }
    else {
      pcVar5 = (char *)0x0;
    }
    _Var1 = parser_hasval(p,"labelcolors");
    if (_Var1) {
      pcVar7 = parser_getsym(p,"labelcolors");
      iVar3 = strcmp(pcVar7,"*");
      pcVar6 = (char *)0x0;
      if (iVar3 != 0) {
        pcVar6 = pcVar7;
      }
    }
    else {
      pcVar6 = (char *)0x0;
    }
    _Var1 = parser_hasval(p,"symbols");
    if (_Var1) {
      pcVar7 = parser_getsym(p,"symbols");
    }
    else {
      pcVar7 = (char *)0x0;
    }
    wVar2 = ui_entry_renderer_customize(wVar2,pcVar5,pcVar6,pcVar7);
    pVar4 = PARSE_ERROR_INVALID_VALUE;
    if (wVar2 == L'\0') {
      pVar4 = PARSE_ERROR_NONE;
    }
  }
  return pVar4;
}

Assistant:

static enum parser_error parse_prefs_entry_renderer(struct parser *p)
{
	const char* name = parser_getsym(p, "name");
	const char* colors;
	const char* label_colors;
	const char* symbols;
	int index;

	index = ui_entry_renderer_lookup(name);
	if (index == 0) {
		return PARSE_ERROR_INVALID_VALUE;
	}
	if (parser_hasval(p, "colors")) {
		colors = parser_getsym(p, "colors");
		if (streq(colors, "*")) {
			colors = NULL;
		}
	} else {
		colors = NULL;
	}
	if (parser_hasval(p, "labelcolors")) {
		label_colors = parser_getsym(p, "labelcolors");
		if (streq(label_colors, "*")) {
			label_colors = NULL;
		}
	} else {
		label_colors = NULL;
	}
	if (parser_hasval(p, "symbols")) {
		symbols = parser_getsym(p, "symbols");
	} else {
		symbols = NULL;
	}
	if (ui_entry_renderer_customize(index, colors, label_colors, symbols)) {
		return PARSE_ERROR_INVALID_VALUE;
	}
	return PARSE_ERROR_NONE;
}